

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void AddStringToLexer(Lexer *lexer,ctmbstr str)

{
  byte *pbStack_18;
  uint c;
  ctmbstr str_local;
  Lexer *lexer_local;
  
  pbStack_18 = (byte *)str;
  while( true ) {
    if (*pbStack_18 == 0) break;
    prvTidyAddCharToLexer(lexer,(uint)*pbStack_18);
    pbStack_18 = pbStack_18 + 1;
  }
  return;
}

Assistant:

static void AddStringToLexer( Lexer *lexer, ctmbstr str )
{
    uint c;

    /*  Many (all?) compilers will sign-extend signed chars (the default) when
    **  converting them to unsigned integer values.  We must cast our char to
    **  unsigned char before assigning it to prevent this from happening.
    */
    while( 0 != (c = (unsigned char) *str++ ))
        TY_(AddCharToLexer)( lexer, c );
}